

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::object_method> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
::alloc<cs::object_method&>
          (allocator_type<cs_impl::any::holder<cs::object_method>,_64UL,_cs_impl::default_allocator_provider>
           *this,object_method *args)

{
  long lVar1;
  __int_type _Var2;
  holder<cs::object_method> *phVar3;
  new_allocator<cs_impl::any::holder<cs::object_method>_> *in_RSI;
  new_allocator<cs_impl::any::holder<cs::object_method>_> *in_RDI;
  holder<cs::object_method> *ptr;
  holder<cs::object_method> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<cs::object_method> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_005240f2;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::object_method>_>::allocate
                     (in_RSI,__n,in_RDI);
LAB_005240f2:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::object_method>>::
  construct<cs_impl::any::holder<cs::object_method>,cs::object_method&>
            (in_RDI,in_stack_ffffffffffffffd8,(object_method *)0x52410d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}